

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

int GA_Assemble_duplicate(int g_a,char *array_name,void *ptr)

{
  int handle;
  global_array_t *pgVar1;
  int iVar2;
  char **ppcVar3;
  C_Integer *pCVar4;
  bool bVar5;
  global_array_t *pgVar6;
  global_array_t *pgVar7;
  uint uVar8;
  int *piVar9;
  C_Integer *pCVar10;
  Integer IVar11;
  uint uVar12;
  long lVar13;
  long *plVar14;
  ulong uVar15;
  ulong uVar16;
  char err_string [256];
  
  iVar2 = (int)GAnproc * 8;
  handle = g_a + 1000;
  uVar8 = calc_maplen(handle);
  pnga_sync();
  GAstat.numcre = GAstat.numcre + 1;
  if ((g_a < -1000) || (_max_global_array <= handle)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_assemble_duplicate");
    pnga_error(err_string,(long)g_a);
  }
  if (GA[handle].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_assemble_duplicate");
    pnga_error(err_string,(long)g_a);
  }
  plVar14 = (long *)((long)ptr - (long)(iVar2 + 0x20));
  piVar9 = &GA->actv_handle;
  uVar12 = 0xffffffff;
  lVar13 = 1;
  do {
    iVar2 = *piVar9;
    uVar12 = uVar12 + 1;
    if (iVar2 == 0) break;
    piVar9 = piVar9 + 0xda;
    bVar5 = lVar13 < _max_global_array;
    lVar13 = lVar13 + 1;
  } while (bVar5);
  uVar12 = -(uint)(iVar2 != 0) | uVar12;
  if (iVar2 != 0) {
    pnga_error("ga_assemble_duplicate: too many arrays ",(long)_max_global_array);
  }
  gai_init_struct(uVar12);
  pgVar7 = GA;
  pgVar1 = GA + (int)uVar12;
  pgVar6 = GA + (int)uVar12;
  GA[(int)uVar12].actv_handle = 1;
  ppcVar3 = pgVar7[(int)uVar12].ptr;
  memcpy(pgVar1,pgVar7 + handle,0x368);
  strcpy(pgVar6->name,array_name);
  GA[(int)uVar12].ptr = ppcVar3;
  if (0 < (int)uVar8) {
    uVar16 = (ulong)uVar8;
    pCVar10 = (C_Integer *)malloc(uVar16 * 8 + 8);
    GA[(int)uVar12].mapc = pCVar10;
    pgVar1 = GA + (int)uVar12;
    pCVar10 = GA[handle].mapc;
    pCVar4 = GA[(int)uVar12].mapc;
    for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      pCVar4[uVar15] = pCVar10[uVar15];
    }
    pgVar1->mapc[uVar16] = -1;
  }
  IVar11 = pnga_type_f2c(plVar14[1]);
  if (999 < IVar11) {
    IVar11 = pnga_type_f2c(plVar14[1]);
    if (IVar11 < 0x4e8) {
      IVar11 = pnga_type_f2c(plVar14[1]);
      if (*(int *)(BYTE_ARRAY_001cf599 + IVar11 * 0x10 + 7) != 0) goto LAB_00164155;
    }
  }
  IVar11 = pnga_type_f2c(plVar14[1]);
  pnga_error("type not yet supported",IVar11);
LAB_00164155:
  IVar11 = pnga_type_f2c(plVar14[1]);
  pgVar1 = GA;
  GA[(int)uVar12].type = (int)IVar11;
  pgVar1[(int)uVar12].size = plVar14[2];
  pgVar1[(int)uVar12].id = *plVar14;
  memcpy(pgVar1[(int)uVar12].ptr,plVar14 + 4,CONCAT44(GAnproc._4_4_,(int)GAnproc) << 3);
  GAstat.curmem = GAstat.curmem + GA[(int)uVar12].size;
  lVar13 = GAstat.curmem;
  if (GAstat.curmem < GAstat.maxmem) {
    lVar13 = GAstat.maxmem;
  }
  GAstat.maxmem = lVar13;
  pnga_sync();
  return uVar12 - 1000;
}

Assistant:

int GA_Assemble_duplicate(int g_a, char* array_name, void* ptr)
{
char     **save_ptr;
int      i, ga_handle;
int extra = sizeof(getmem_t)+GAnproc*sizeof(char*);
getmem_t *info = (getmem_t *)((char*)ptr - extra);
char **ptr_arr = (char**)(info+1);
int g_b;
int maplen = calc_maplen(GA_OFFSET + g_a);


      pnga_sync();

      GAstat.numcre ++;

      ga_check_handleM(g_a,"ga_assemble_duplicate");

      /* find a free global_array handle for g_b */
      ga_handle =-1; i=0;
      do{
        if(!GA[i].actv_handle) ga_handle=i;
        i++;
      }while(i<_max_global_array && ga_handle==-1);
      if( ga_handle == -1)
          pnga_error("ga_assemble_duplicate: too many arrays ", 
                                           (Integer)_max_global_array);
      g_b = ga_handle - GA_OFFSET;

      gai_init_struct(ga_handle);
      GA[ga_handle].actv_handle = 1;

      /*** copy content of the data structure ***/
      save_ptr = GA[ga_handle].ptr;
      GA[ga_handle] = GA[GA_OFFSET + g_a];
      strcpy(GA[ga_handle].name, array_name);
      GA[ga_handle].ptr = save_ptr;
      if (maplen > 0) {
        GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
        for(i=0;i<maplen; i++)GA[ga_handle].mapc[i] = GA[GA_OFFSET+ g_a].mapc[i];
        GA[ga_handle].mapc[maplen] = -1;
      }

      /* get ptrs and datatype from user memory */
      gam_checktype(pnga_type_f2c(info->type));
      GA[ga_handle].type = pnga_type_f2c(info->type);
      GA[ga_handle].size = (C_Long)info->size;
      GA[ga_handle].id = info->id;
      memcpy(GA[ga_handle].ptr,ptr_arr,(size_t)GAnproc*sizeof(char**));

      GAstat.curmem += (long)GA[ga_handle].size;
      GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);

      pnga_sync();

      return(g_b);
}